

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionManager.cpp
# Opt level: O0

CK_RV __thiscall SessionManager::closeAllSessions(SessionManager *this,Slot *slot)

{
  bool bVar1;
  Token *this_00;
  reference ppSVar2;
  Slot *this_01;
  Slot *in_RSI;
  iterator i;
  CK_SLOT_ID slotID;
  Token *token;
  MutexLocker lock;
  Mutex *in_stack_ffffffffffffff68;
  Session *in_stack_ffffffffffffff70;
  __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>
  *in_stack_ffffffffffffff78;
  __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_> local_50;
  __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_> *local_48;
  undefined4 local_40;
  Token *local_30;
  Slot *local_18;
  CK_RV local_8;
  
  if (in_RSI == (Slot *)0x0) {
    local_8 = 3;
  }
  else {
    local_18 = in_RSI;
    MutexLocker::MutexLocker((MutexLocker *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    this_00 = Slot::getToken(local_18);
    local_30 = this_00;
    if (this_00 == (Token *)0x0) {
      local_8 = 0xe0;
    }
    else {
      local_48 = (__normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>
                  *)Slot::getSlotID(local_18);
      local_50._M_current =
           (Session **)
           std::vector<Session_*,_std::allocator<Session_*>_>::begin
                     ((vector<Session_*,_std::allocator<Session_*>_> *)in_stack_ffffffffffffff68);
      while( true ) {
        std::vector<Session_*,_std::allocator<Session_*>_>::end
                  ((vector<Session_*,_std::allocator<Session_*>_> *)in_stack_ffffffffffffff68);
        bVar1 = __gnu_cxx::operator!=
                          ((__normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>
                            *)in_stack_ffffffffffffff70,
                           (__normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>
                            *)in_stack_ffffffffffffff68);
        if (!bVar1) break;
        ppSVar2 = __gnu_cxx::
                  __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>
                  ::operator*(&local_50);
        if (*ppSVar2 != (Session *)0x0) {
          ppSVar2 = __gnu_cxx::
                    __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>
                    ::operator*(&local_50);
          this_01 = Session::getSlot(*ppSVar2);
          in_stack_ffffffffffffff78 =
               (__normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_> *
               )Slot::getSlotID(this_01);
          if (in_stack_ffffffffffffff78 == local_48) {
            ppSVar2 = __gnu_cxx::
                      __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>
                      ::operator*(&local_50);
            in_stack_ffffffffffffff70 = *ppSVar2;
            if (in_stack_ffffffffffffff70 != (Session *)0x0) {
              (*in_stack_ffffffffffffff70->_vptr_Session[1])();
            }
            ppSVar2 = __gnu_cxx::
                      __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>
                      ::operator*(&local_50);
            *ppSVar2 = (Session *)0x0;
          }
        }
        __gnu_cxx::
        __normal_iterator<Session_**,_std::vector<Session_*,_std::allocator<Session_*>_>_>::
        operator++(in_stack_ffffffffffffff78,(int)((ulong)in_stack_ffffffffffffff70 >> 0x20));
      }
      Token::logout(this_00);
      local_8 = 0;
    }
    local_40 = 1;
    MutexLocker::~MutexLocker((MutexLocker *)in_stack_ffffffffffffff70);
  }
  return local_8;
}

Assistant:

CK_RV SessionManager::closeAllSessions(Slot* slot)
{
	if (slot == NULL) return CKR_SLOT_ID_INVALID;

	// Lock access to the vector
	MutexLocker lock(sessionsMutex);

	// Get the token
	Token* token = slot->getToken();
	if (token == NULL) return CKR_TOKEN_NOT_PRESENT;

	// Close all sessions on this slot
	const CK_SLOT_ID slotID( slot->getSlotID() );
	for (std::vector<Session*>::iterator i = sessions.begin(); i != sessions.end(); i++)
	{
		if (*i == NULL) continue;

		if ((*i)->getSlot()->getSlotID() == slotID)
		{
			delete *i;
			*i = NULL;
		}
	}

	// Logout from the token
	token->logout();

	return CKR_OK;
}